

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
emplaceRealloc<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this,
          pointer pos,TypeSetter *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 *puVar4;
  Expression *pEVar5;
  undefined8 uVar6;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  long lVar10;
  long lVar11;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pTVar8 = (pointer)detail::allocArray(capacity,0x10);
  pEVar5 = (args->expr).ptr;
  *(undefined8 *)((long)pTVar8 + lVar11) = (args->type).ptr;
  ((undefined8 *)((long)pTVar8 + lVar11))[1] = pEVar5;
  pTVar9 = this->data_;
  sVar3 = this->len;
  pTVar7 = pTVar8;
  if (pTVar9 + sVar3 == pos) {
    if (sVar3 != 0) {
      lVar10 = 0;
      do {
        puVar4 = (undefined8 *)((long)&(pTVar9->type).ptr + lVar10);
        uVar6 = puVar4[1];
        puVar1 = (undefined8 *)((long)&(pTVar8->type).ptr + lVar10);
        *puVar1 = *puVar4;
        puVar1[1] = uVar6;
        lVar10 = lVar10 + 0x10;
      } while (sVar3 * 0x10 != lVar10);
    }
  }
  else {
    for (; pTVar9 != pos; pTVar9 = pTVar9 + 1) {
      pEVar5 = (pTVar9->expr).ptr;
      (pTVar7->type).ptr = (pTVar9->type).ptr;
      (pTVar7->expr).ptr = pEVar5;
      pTVar7 = pTVar7 + 1;
    }
    sVar3 = this->len;
    pTVar9 = this->data_;
    if (pTVar9 + sVar3 != pos) {
      puVar4 = (undefined8 *)((long)pTVar8 + lVar11);
      do {
        pEVar5 = (pos->expr).ptr;
        puVar4[2] = (pos->type).ptr;
        puVar4[3] = pEVar5;
        pos = pos + 1;
        puVar4 = puVar4 + 2;
      } while (pos != pTVar9 + sVar3);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pTVar8;
  return (pointer)((long)pTVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}